

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderSharedVarTests::init(ShaderSharedVarTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  DataType DVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  SharedBasicVarCase *pSVar3;
  char *pcVar4;
  ShaderAtomicOpTests *this_00;
  Precision precision;
  DataType dataType;
  allocator<char> local_b1;
  UVec3 workGroupSize;
  UVec3 workGroupSize_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic_type",
             "Basic Types");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (dataType = TYPE_FLOAT; dataType != TYPE_SAMPLER_1D; dataType = dataType + TYPE_FLOAT) {
    DVar1 = glu::getDataTypeScalarType(dataType);
    if (DVar1 != TYPE_DOUBLE) {
      if (dataType - TYPE_BOOL < 4) {
        workGroupSize.m_data[0] = 2;
        workGroupSize.m_data[1] = 1;
        workGroupSize.m_data[2] = 3;
        pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
        context = (this->super_TestCaseGroup).m_context;
        pcVar4 = glu::getDataTypeName(dataType);
        SharedBasicVarCase::SharedBasicVarCase
                  (pSVar3,context,pcVar4,dataType,PRECISION_LAST,&workGroupSize);
        tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
      }
      else {
        for (precision = PRECISION_LOWP; precision != PRECISION_LAST;
            precision = precision + PRECISION_MEDIUMP) {
          workGroupSize_1.m_data[0] = 2;
          workGroupSize_1.m_data[1] = 1;
          workGroupSize_1.m_data[2] = 3;
          pcVar4 = glu::getDataTypeName(dataType);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar4,&local_b1);
          std::operator+(&local_50,&local_70,"_");
          pcVar4 = glu::getPrecisionName(precision);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &workGroupSize,&local_50,pcVar4);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
          SharedBasicVarCase::SharedBasicVarCase
                    (pSVar3,(this->super_TestCaseGroup).m_context,(char *)workGroupSize.m_data._0_8_
                     ,dataType,precision,&workGroupSize_1);
          tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
          std::__cxx11::string::~string((string *)&workGroupSize);
        }
      }
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "work_group_size","Shared Variables with Various Work Group Sizes");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data._0_8_ = &DAT_100000001;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_1_1_1",TYPE_FLOAT,PRECISION_HIGHP,
             &workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0x40;
  workGroupSize.m_data[1] = 1;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_64_1_1",TYPE_FLOAT,PRECISION_HIGHP,
             &workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 1;
  workGroupSize.m_data[1] = 0x40;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_1_64_1",TYPE_FLOAT,PRECISION_HIGHP,
             &workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data._0_8_ = &DAT_100000001;
  workGroupSize.m_data[2] = 0x40;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_1_1_64",TYPE_FLOAT,PRECISION_HIGHP,
             &workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0x80;
  workGroupSize.m_data[1] = 1;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_128_1_1",TYPE_FLOAT,PRECISION_HIGHP
             ,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 1;
  workGroupSize.m_data[1] = 0x80;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_1_128_1",TYPE_FLOAT,PRECISION_HIGHP
             ,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0xd;
  workGroupSize.m_data[1] = 2;
  workGroupSize.m_data[2] = 4;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"float_13_2_4",TYPE_FLOAT,PRECISION_HIGHP,
             &workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data._0_8_ = &DAT_100000001;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_1_1_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0x40;
  workGroupSize.m_data[1] = 1;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_64_1_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 1;
  workGroupSize.m_data[1] = 0x40;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_1_64_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data._0_8_ = &DAT_100000001;
  workGroupSize.m_data[2] = 0x40;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_1_1_64",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0x80;
  workGroupSize.m_data[1] = 1;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_128_1_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 1;
  workGroupSize.m_data[1] = 0x80;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_1_128_1",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0xd;
  workGroupSize.m_data[1] = 2;
  workGroupSize.m_data[2] = 4;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"vec4_13_2_4",TYPE_FLOAT_VEC4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data._0_8_ = &DAT_100000001;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_1_1_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0x40;
  workGroupSize.m_data[1] = 1;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_64_1_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 1;
  workGroupSize.m_data[1] = 0x40;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_1_64_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data._0_8_ = &DAT_100000001;
  workGroupSize.m_data[2] = 0x40;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_1_1_64",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0x80;
  workGroupSize.m_data[1] = 1;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_128_1_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 1;
  workGroupSize.m_data[1] = 0x80;
  workGroupSize.m_data[2] = 1;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_1_128_1",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SharedBasicVarCase *)operator_new(0x98);
  workGroupSize.m_data[0] = 0xd;
  workGroupSize.m_data[1] = 2;
  workGroupSize.m_data[2] = 4;
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"mat4_13_2_4",TYPE_FLOAT_MAT4,
             PRECISION_HIGHP,&workGroupSize);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  this_00 = (ShaderAtomicOpTests *)operator_new(0x80);
  ShaderAtomicOpTests::ShaderAtomicOpTests
            (this_00,(this->super_TestCaseGroup).m_context,"atomic",ATOMIC_OPERAND_SHARED_VARIABLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void ShaderSharedVarTests::init (void)
{
	// .basic_type
	{
		tcu::TestCaseGroup *const basicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "basic_type", "Basic Types");
		addChild(basicTypeGroup);

		for (int basicType = TYPE_FLOAT; basicType <= TYPE_BOOL_VEC4; basicType++)
		{
			if (glu::getDataTypeScalarType(DataType(basicType)) == glu::TYPE_DOUBLE)
				continue;

			if (glu::isDataTypeBoolOrBVec(DataType(basicType)))
			{
				const tcu::UVec3	workGroupSize	(2,1,3);
				basicTypeGroup->addChild(new SharedBasicVarCase(m_context, getDataTypeName(DataType(basicType)), DataType(basicType), PRECISION_LAST, workGroupSize));
			}
			else
			{
				for (int precision = 0; precision < PRECISION_LAST; precision++)
				{
					const tcu::UVec3	workGroupSize	(2,1,3);
					const string		name			= string(getDataTypeName(DataType(basicType))) + "_" + getPrecisionName(Precision(precision));

					basicTypeGroup->addChild(new SharedBasicVarCase(m_context, name.c_str(), DataType(basicType), Precision(precision), workGroupSize));
				}
			}
		}
	}

	// .work_group_size
	{
		tcu::TestCaseGroup *const workGroupSizeGroup = new tcu::TestCaseGroup(m_testCtx, "work_group_size", "Shared Variables with Various Work Group Sizes");
		addChild(workGroupSizeGroup);

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_64_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_64_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_1_64",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_128_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_128_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_13_2_4",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(13,2,4)));

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_64_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_64_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_1_64",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_128_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_128_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_13_2_4",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(13,2,4)));

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_64_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_64_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_1_64",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_128_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_128_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_13_2_4",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(13,2,4)));
	}

	// .atomic
	addChild(new ShaderAtomicOpTests(m_context, "atomic", ATOMIC_OPERAND_SHARED_VARIABLE));
}